

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::SIMDFastPFor<4U>::getBestBFromData
          (SIMDFastPFor<4U> *this,uint32_t *in,uint8_t *bestb,uint8_t *bestcexcept,uint8_t *maxb)

{
  byte bVar1;
  uint32_t k;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int aiStack_98 [34];
  
  for (lVar3 = 0; lVar3 != 0x21; lVar3 = lVar3 + 1) {
    aiStack_98[lVar3] = 0;
  }
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    uVar6 = in[lVar3];
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = iVar2 + 1;
    }
    aiStack_98[uVar6] = aiStack_98[uVar6] + 1;
  }
  bVar1 = 0x21;
  do {
    bVar1 = bVar1 - 1;
  } while (aiStack_98[bVar1] == 0);
  *bestb = bVar1;
  *maxb = bVar1;
  iVar2 = 0;
  bVar1 = *bestb;
  *bestcexcept = '\0';
  uVar7 = (uint)*bestb;
  uVar6 = (uint)bVar1 << 7;
  do {
    iVar10 = (*maxb - uVar7) + 8;
    uVar8 = uVar7 << 7 | 8;
    do {
      uVar4 = (ulong)uVar7;
      uVar7 = uVar7 - 1;
      if (0x1f < uVar7) {
        return;
      }
      iVar2 = iVar2 + aiStack_98[uVar4];
      iVar10 = iVar10 + 1;
      uVar9 = uVar8 - 0x80;
      uVar5 = iVar10 * iVar2 + -0x80 + uVar8;
      uVar8 = uVar9;
    } while (uVar6 <= uVar5);
    uVar6 = iVar10 * iVar2 + uVar9;
    *bestb = (uint8_t)uVar7;
    *bestcexcept = (uint8_t)iVar2;
  } while( true );
}

Assistant:

void getBestBFromData(const uint32_t *in, uint8_t &bestb,
                        uint8_t &bestcexcept, uint8_t &maxb) {
    uint32_t freqs[33];
    for (uint32_t k = 0; k <= 32; ++k)
      freqs[k] = 0;
    for (uint32_t k = 0; k < BlockSize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    bestb = 32;
    while (freqs[bestb] == 0)
      bestb--;
    maxb = bestb;
    uint32_t bestcost = bestb * BlockSize;
    uint32_t cexcept = 0;
    bestcexcept = static_cast<uint8_t>(cexcept);
    for (uint32_t b = bestb - 1; b < 32; --b) {
      cexcept += freqs[b + 1];
      uint32_t thiscost = cexcept * overheadofeachexcept +
                          cexcept * (maxb - b) + b * BlockSize +
                          8; // the  extra 8 is the cost of storing maxbits
      if (thiscost < bestcost) {
        bestcost = thiscost;
        bestb = static_cast<uint8_t>(b);
        bestcexcept = static_cast<uint8_t>(cexcept);
      }
    }
  }